

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

void __thiscall BanMan::Discourage(BanMan *this,CNetAddr *net_addr)

{
  long lVar1;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock8,&this->m_banned_mutex,"m_banned_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
             ,0x7e,false);
  CNetAddr::GetAddrBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,net_addr);
  vKey.m_size = (long)local_40._M_impl.super__Vector_impl_data._M_finish -
                (long)local_40._M_impl.super__Vector_impl_data._M_start;
  vKey.m_data = local_40._M_impl.super__Vector_impl_data._M_start;
  CRollingBloomFilter::insert(&this->m_discouraged,vKey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock8.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::Discourage(const CNetAddr& net_addr)
{
    LOCK(m_banned_mutex);
    m_discouraged.insert(net_addr.GetAddrBytes());
}